

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

lest * __thiscall lest::with_message(lest *this,text *message)

{
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  text *local_18;
  text *message_local;
  
  local_18 = message;
  message_local = (text *)this;
  std::operator+((char *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "with message \"");
  std::operator+(local_38,(char *)local_58);
  std::__cxx11::string::string((string *)this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  return this;
}

Assistant:

inline text with_message( text message )
{
    return "with message \"" + message + "\"";
}